

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  QPDF q;
  shared_ptr<BufferInputSource> is;
  Buffer buf;
  undefined1 local_79;
  QPDF local_78;
  string local_70;
  Buffer local_50;
  shared_ptr<InputSource> local_48;
  Buffer *local_38;
  JSON local_30;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,this->data,this->data + this->size);
  JSON::parse(&local_30,&local_70);
  if (local_30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  QPDF::QPDF(&local_78);
  QPDF::setMaxWarnings(&local_78,1000);
  Buffer::Buffer(&local_50,this->data,this->size);
  local_70._M_dataplus._M_p = (pointer)0x0;
  local_38 = &local_50;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<BufferInputSource,std::allocator<BufferInputSource>,char_const(&)[5],Buffer*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length,
             (BufferInputSource **)&local_70,(allocator<BufferInputSource> *)&local_79,
             (char (*) [5])0x282701,&local_38);
  local_48.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70._M_dataplus._M_p;
  local_48.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_70._M_string_length + 8) =
           *(_Atomic_word *)(local_70._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_70._M_string_length + 8) =
           *(_Atomic_word *)(local_70._M_string_length + 8) + 1;
    }
  }
  QPDF::createFromJSON(&local_78,&local_48);
  if (local_48.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
  }
  Buffer::~Buffer(&local_50);
  QPDF::~QPDF(&local_78);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    try {
        JSON::parse(std::string(reinterpret_cast<char const*>(data), size));
    } catch (std::runtime_error& e) {
        std::cerr << "runtime_error parsing json: " << e.what() << std::endl;
    }
    QPDF q;
    q.setMaxWarnings(1000);
    Buffer buf(const_cast<unsigned char*>(data), size);
    auto is = std::make_shared<BufferInputSource>("json", &buf);
    q.createFromJSON(is);
}